

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TokenStreamException.hpp
# Opt level: O2

void __thiscall antlr::TokenStreamException::~TokenStreamException(TokenStreamException *this)

{
  ANTLRException::~ANTLRException(&this->super_ANTLRException);
  operator_delete(this,0x28);
  return;
}

Assistant:

virtual ~TokenStreamException() throw()
	{
	}